

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_remove(lua_State *L,TString *ts)

{
  int *piVar1;
  global_State *pgVar2;
  TString *pTVar3;
  anon_union_8_2_b887aad4_for_u *paVar4;
  anon_union_8_2_b887aad4_for_u *paVar5;
  
  pgVar2 = L->l_G;
  paVar4 = (anon_union_8_2_b887aad4_for_u *)
           ((pgVar2->strt).hash + ((pgVar2->strt).size - 1U & ts->hash));
  do {
    paVar5 = paVar4;
    pTVar3 = paVar5->hnext;
    paVar4 = &pTVar3->u;
  } while (pTVar3 != ts);
  *paVar5 = *(TString **)paVar4;
  piVar1 = &(pgVar2->strt).nuse;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void luaS_remove (lua_State *L, TString *ts) {
  stringtable *tb = &G(L)->strt;
  TString **p = &tb->hash[lmod(ts->hash, tb->size)];
  while (*p != ts)  /* find previous element */
    p = &(*p)->u.hnext;
  *p = (*p)->u.hnext;  /* remove element from its list */
  tb->nuse--;
}